

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O0

void __thiscall
absl::strings_internal::BigUnsigned<4>::MultiplyStep
          (BigUnsigned<4> *this,int original_size,uint32_t *other_words,int other_size,int step)

{
  int iVar1;
  int *piVar2;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  uint64_t product;
  uint64_t carry;
  uint64_t this_word;
  int other_i;
  int this_i;
  uint64_t value;
  ulong uVar3;
  undefined4 in_stack_ffffffffffffffd0;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  
  local_28 = in_ESI + -1;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  piVar2 = std::min<int>(&local_28,&local_20);
  local_24 = *piVar2;
  iVar1 = local_20 - local_24;
  uVar3 = 0;
  value = 0;
  for (; -1 < local_24 && iVar1 < local_1c; local_24 = local_24 + -1) {
    uVar3 = (ulong)*(uint *)(local_18 + (long)iVar1 * 4) * (ulong)(uint)in_RDI[(long)local_24 + 1] +
            uVar3;
    value = (uVar3 >> 0x20) + value;
    uVar3 = uVar3 & 0xffffffff;
    iVar1 = iVar1 + 1;
  }
  AddWithCarry((BigUnsigned<4> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0,value);
  in_RDI[(long)local_20 + 1] = (int)uVar3;
  if ((uVar3 != 0) && (*in_RDI <= local_20)) {
    *in_RDI = local_20 + 1;
  }
  return;
}

Assistant:

void BigUnsigned<max_words>::MultiplyStep(int original_size,
                                          const uint32_t* other_words,
                                          int other_size, int step) {
  int this_i = std::min(original_size - 1, step);
  int other_i = step - this_i;

  uint64_t this_word = 0;
  uint64_t carry = 0;
  for (; this_i >= 0 && other_i < other_size; --this_i, ++other_i) {
    uint64_t product = words_[this_i];
    product *= other_words[other_i];
    this_word += product;
    carry += (this_word >> 32);
    this_word &= 0xffffffff;
  }
  AddWithCarry(step + 1, carry);
  words_[step] = this_word & 0xffffffff;
  if (this_word > 0 && size_ <= step) {
    size_ = step + 1;
  }
}